

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newpfor.h
# Opt level: O1

uint32_t __thiscall
FastPForLib::NewPFor<4U,_FastPForLib::Simple16<false>_>::findBestB
          (NewPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t *in,uint32_t len)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ushort uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  int iVar24;
  undefined1 auVar25 [64];
  
  uVar8 = (ulong)len;
  if (len == 0) {
    iVar24 = 0;
  }
  else {
    auVar18 = vpbroadcastq_avx512f();
    auVar25 = ZEXT1664((undefined1  [16])0x0);
    lVar13 = 0;
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar21 = vmovdqa64_avx512f(auVar25);
      auVar25 = vpbroadcastq_avx512f();
      auVar22 = vporq_avx512f(auVar25,auVar19);
      auVar25 = vporq_avx512f(auVar25,auVar20);
      uVar4 = vpcmpuq_avx512f(auVar25,auVar18,2);
      bVar6 = (byte)uVar4;
      uVar4 = vpcmpuq_avx512f(auVar22,auVar18,2);
      bVar7 = (byte)uVar4;
      uVar16 = CONCAT11(bVar7,bVar6);
      auVar25 = vmovdqu32_avx512f(*(undefined1 (*) [64])(in + lVar13));
      auVar22._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar25._4_4_;
      auVar22._0_4_ = (uint)(bVar6 & 1) * auVar25._0_4_;
      auVar22._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar25._8_4_;
      auVar22._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar25._12_4_;
      auVar22._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar25._16_4_;
      auVar22._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar25._20_4_;
      auVar22._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar25._24_4_;
      auVar22._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar25._28_4_;
      auVar22._32_4_ = (uint)(bVar7 & 1) * auVar25._32_4_;
      auVar22._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar25._36_4_;
      auVar22._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar25._40_4_;
      auVar22._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar25._44_4_;
      auVar22._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar25._48_4_;
      auVar22._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar25._52_4_;
      auVar22._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar25._56_4_;
      auVar22._60_4_ = (uint)(bVar7 >> 7) * auVar25._60_4_;
      auVar25 = vpord_avx512f(auVar22,auVar21);
      lVar13 = lVar13 + 0x10;
    } while (((uVar8 + 0x3fffffffffffffff & 0x3fffffffffffffff) + 0x10) -
             (ulong)((uint)(uVar8 + 0x3fffffffffffffff) & 0xf) != lVar13);
    auVar18 = vmovdqa32_avx512f(auVar25);
    auVar19._0_4_ = (uint)(bVar6 & 1) * auVar18._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar21._0_4_;
    bVar1 = (bool)((byte)(uVar16 >> 1) & 1);
    auVar19._4_4_ = (uint)bVar1 * auVar18._4_4_ | (uint)!bVar1 * auVar21._4_4_;
    bVar1 = (bool)((byte)(uVar16 >> 2) & 1);
    auVar19._8_4_ = (uint)bVar1 * auVar18._8_4_ | (uint)!bVar1 * auVar21._8_4_;
    bVar1 = (bool)((byte)(uVar16 >> 3) & 1);
    auVar19._12_4_ = (uint)bVar1 * auVar18._12_4_ | (uint)!bVar1 * auVar21._12_4_;
    bVar1 = (bool)((byte)(uVar16 >> 4) & 1);
    auVar19._16_4_ = (uint)bVar1 * auVar18._16_4_ | (uint)!bVar1 * auVar21._16_4_;
    bVar1 = (bool)((byte)(uVar16 >> 5) & 1);
    auVar19._20_4_ = (uint)bVar1 * auVar18._20_4_ | (uint)!bVar1 * auVar21._20_4_;
    bVar1 = (bool)((byte)(uVar16 >> 6) & 1);
    auVar19._24_4_ = (uint)bVar1 * auVar18._24_4_ | (uint)!bVar1 * auVar21._24_4_;
    bVar1 = (bool)((byte)(uVar16 >> 7) & 1);
    auVar19._28_4_ = (uint)bVar1 * auVar18._28_4_ | (uint)!bVar1 * auVar21._28_4_;
    auVar19._32_4_ = (uint)(bVar7 & 1) * auVar18._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar21._32_4_;
    bVar1 = (bool)(bVar7 >> 1 & 1);
    auVar19._36_4_ = (uint)bVar1 * auVar18._36_4_ | (uint)!bVar1 * auVar21._36_4_;
    bVar1 = (bool)(bVar7 >> 2 & 1);
    auVar19._40_4_ = (uint)bVar1 * auVar18._40_4_ | (uint)!bVar1 * auVar21._40_4_;
    bVar1 = (bool)(bVar7 >> 3 & 1);
    auVar19._44_4_ = (uint)bVar1 * auVar18._44_4_ | (uint)!bVar1 * auVar21._44_4_;
    bVar1 = (bool)(bVar7 >> 4 & 1);
    auVar19._48_4_ = (uint)bVar1 * auVar18._48_4_ | (uint)!bVar1 * auVar21._48_4_;
    bVar1 = (bool)(bVar7 >> 5 & 1);
    auVar19._52_4_ = (uint)bVar1 * auVar18._52_4_ | (uint)!bVar1 * auVar21._52_4_;
    bVar1 = (bool)(bVar7 >> 6 & 1);
    auVar19._56_4_ = (uint)bVar1 * auVar18._56_4_ | (uint)!bVar1 * auVar21._56_4_;
    auVar19._60_4_ =
         (uint)(bVar7 >> 7) * auVar18._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar21._60_4_;
    auVar17 = vextracti64x4_avx512f(auVar19,1);
    auVar18 = vpord_avx512f(auVar19,ZEXT3264(auVar17));
    auVar2 = vpor_avx(auVar18._0_16_,auVar18._16_16_);
    auVar3 = vpshufd_avx(auVar2,0xee);
    auVar2 = vpor_avx(auVar2,auVar3);
    auVar3 = vpshufd_avx(auVar2,0x55);
    auVar2 = vpor_avx(auVar2,auVar3);
    iVar24 = auVar2._0_4_;
  }
  uVar14 = 0xffffffff;
  do {
    uVar12 = (int)uVar14 + 1;
    uVar14 = (ulong)uVar12;
    if (iVar24 == 0) break;
  } while (*(int *)(NewPFor<4u,FastPForLib::Simple16<false>>::possLogs + uVar14 * 4) + 0x1cU <
           0x20U - LZCOUNT(iVar24));
  uVar15 = (DAT_001c0548 - NewPFor<4u,FastPForLib::Simple16<false>>::possLogs >> 2) - 1;
  uVar14 = (ulong)uVar12;
  if (uVar14 < uVar15) {
    uVar9 = uVar8 - 1;
    auVar18 = vpbroadcastq_avx512f();
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      uVar12 = *(uint *)(NewPFor<4u,FastPForLib::Simple16<false>>::possLogs + uVar14 * 4);
      uVar10 = 0;
      if ((len != 0) && (uVar12 != 0x20)) {
        auVar25 = vpbroadcastq_avx512f();
        auVar21 = ZEXT1664((undefined1  [16])0x0);
        uVar11 = 0;
        do {
          auVar22 = vmovdqa64_avx512f(auVar21);
          auVar21 = vpbroadcastq_avx512f();
          auVar23 = vporq_avx512f(auVar21,auVar19);
          auVar21 = vporq_avx512f(auVar21,auVar20);
          uVar4 = vpcmpuq_avx512f(auVar21,auVar18,2);
          bVar6 = (byte)uVar4;
          uVar4 = vpcmpuq_avx512f(auVar23,auVar18,2);
          bVar7 = (byte)uVar4;
          uVar16 = CONCAT11(bVar7,bVar6);
          auVar21 = vmovdqu32_avx512f(*(undefined1 (*) [64])(in + uVar11));
          auVar17._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar21._4_4_;
          auVar17._0_4_ = (uint)(bVar6 & 1) * auVar21._0_4_;
          auVar17._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar21._8_4_;
          auVar17._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar21._12_4_;
          auVar17._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar21._16_4_;
          auVar17._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar21._20_4_;
          auVar17._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar21._24_4_;
          auVar17._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar21._28_4_;
          auVar23._32_4_ = (uint)(bVar7 & 1) * auVar21._32_4_;
          auVar23._0_32_ = auVar17;
          auVar23._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar21._36_4_;
          auVar23._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar21._40_4_;
          auVar23._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar21._44_4_;
          auVar23._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar21._48_4_;
          auVar23._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar21._52_4_;
          auVar23._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar21._56_4_;
          auVar23._60_4_ = (uint)(bVar7 >> 7) * auVar21._60_4_;
          auVar21 = vpmovzxdq_avx512f(auVar17);
          auVar17 = vextracti64x4_avx512f(auVar23,1);
          auVar23 = vpmovzxdq_avx512f(auVar17);
          auVar23 = vpsrlvq_avx512f(auVar23,auVar25);
          auVar21 = vpsrlvq_avx512f(auVar21,auVar25);
          uVar4 = vptestmq_avx512f(auVar21,auVar21);
          uVar5 = vptestmq_avx512f(auVar23,auVar23);
          auVar21 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar5,(char)uVar4));
          auVar21 = vpsubd_avx512f(auVar22,auVar21);
          uVar11 = uVar11 + 0x10;
        } while ((uVar8 + 0xf & 0xfffffffffffffff0) != uVar11);
        auVar25 = vmovdqa32_avx512f(auVar21);
        auVar21._0_4_ = (uint)(bVar6 & 1) * auVar25._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar22._0_4_
        ;
        bVar1 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar21._4_4_ = (uint)bVar1 * auVar25._4_4_ | (uint)!bVar1 * auVar22._4_4_;
        bVar1 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar21._8_4_ = (uint)bVar1 * auVar25._8_4_ | (uint)!bVar1 * auVar22._8_4_;
        bVar1 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar21._12_4_ = (uint)bVar1 * auVar25._12_4_ | (uint)!bVar1 * auVar22._12_4_;
        bVar1 = (bool)((byte)(uVar16 >> 4) & 1);
        auVar21._16_4_ = (uint)bVar1 * auVar25._16_4_ | (uint)!bVar1 * auVar22._16_4_;
        bVar1 = (bool)((byte)(uVar16 >> 5) & 1);
        auVar21._20_4_ = (uint)bVar1 * auVar25._20_4_ | (uint)!bVar1 * auVar22._20_4_;
        bVar1 = (bool)((byte)(uVar16 >> 6) & 1);
        auVar21._24_4_ = (uint)bVar1 * auVar25._24_4_ | (uint)!bVar1 * auVar22._24_4_;
        bVar1 = (bool)((byte)(uVar16 >> 7) & 1);
        auVar21._28_4_ = (uint)bVar1 * auVar25._28_4_ | (uint)!bVar1 * auVar22._28_4_;
        auVar21._32_4_ =
             (uint)(bVar7 & 1) * auVar25._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar22._32_4_;
        bVar1 = (bool)(bVar7 >> 1 & 1);
        auVar21._36_4_ = (uint)bVar1 * auVar25._36_4_ | (uint)!bVar1 * auVar22._36_4_;
        bVar1 = (bool)(bVar7 >> 2 & 1);
        auVar21._40_4_ = (uint)bVar1 * auVar25._40_4_ | (uint)!bVar1 * auVar22._40_4_;
        bVar1 = (bool)(bVar7 >> 3 & 1);
        auVar21._44_4_ = (uint)bVar1 * auVar25._44_4_ | (uint)!bVar1 * auVar22._44_4_;
        bVar1 = (bool)(bVar7 >> 4 & 1);
        auVar21._48_4_ = (uint)bVar1 * auVar25._48_4_ | (uint)!bVar1 * auVar22._48_4_;
        bVar1 = (bool)(bVar7 >> 5 & 1);
        auVar21._52_4_ = (uint)bVar1 * auVar25._52_4_ | (uint)!bVar1 * auVar22._52_4_;
        bVar1 = (bool)(bVar7 >> 6 & 1);
        auVar21._56_4_ = (uint)bVar1 * auVar25._56_4_ | (uint)!bVar1 * auVar22._56_4_;
        auVar21._60_4_ =
             (uint)(bVar7 >> 7) * auVar25._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar22._60_4_;
        auVar17 = vextracti64x4_avx512f(auVar21,1);
        auVar25 = vpaddd_avx512f(auVar21,ZEXT3264(auVar17));
        auVar2 = vpaddd_avx(auVar25._0_16_,auVar25._16_16_);
        auVar3 = vpshufd_avx(auVar2,0xee);
        auVar2 = vpaddd_avx(auVar2,auVar3);
        auVar3 = vpshufd_avx(auVar2,0x55);
        auVar2 = vpaddd_avx(auVar2,auVar3);
        uVar10 = auVar2._0_4_ * 10;
      }
      uVar9 = uVar9 & 0xffffffff;
      if (uVar10 <= len) {
        uVar9 = (ulong)uVar12;
      }
      if (uVar10 <= len) {
        return (uint32_t)uVar9;
      }
      uVar14 = (ulong)((int)uVar14 + 1);
    } while (uVar14 < uVar15);
  }
  return *(uint32_t *)(DAT_001c0548 + -4);
}

Assistant:

__attribute__((pure)) uint32_t
NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::findBestB(
    const uint32_t *in, uint32_t len) {
  const uint32_t mb = maxbits(in, in + len);
  uint32_t i = 0;
  while (mb > 28 + possLogs[i])
    ++i; // some schemes such as Simple16 don't code numbers greater than 28

  for (; i < possLogs.size() - 1; i++) {

    const uint32_t nExceptions = tryB(possLogs[i], in, len);
    if (nExceptions * PFORDELTA_INVERSERATIO <= len)
      return possLogs[i];
  }
  return possLogs.back();
}